

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  runtime_error *this_00;
  Ref<embree::XML> *in_RDX;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator==(&in_RDX->ptr->name,"conffile");
  if (!bVar1) {
    this_01 = "mtllib";
    bVar1 = std::operator==(&in_RDX->ptr->name,"mtllib");
    if (bVar1) {
      load<embree::FileName>((FileName *)&bStack_88,(CoronaLoader *)this_01,in_RDX);
      loadMaterialLibrary(this,(FileName *)xml);
      std::__cxx11::string::~string((string *)&bStack_88);
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
    bVar1 = std::operator==(&in_RDX->ptr->name,"camera");
    if ((!bVar1) && (bVar1 = std::operator==(&in_RDX->ptr->name,"environment"), !bVar1)) {
      bVar1 = std::operator==(&in_RDX->ptr->name,"geometryGroup");
      if (bVar1) {
        loadGroupNode(this,xml);
        return (Ref<embree::SceneGraph::Node>)(Node *)this;
      }
      bVar1 = std::operator==(&in_RDX->ptr->name,"renderElement");
      if (!bVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_68,&in_RDX->ptr->loc);
        std::operator+(&local_48,&local_68,": unknown tag: ");
        std::operator+(&bStack_88,&local_48,&in_RDX->ptr->name);
        std::runtime_error::runtime_error(this_00,(string *)&bStack_88);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadNode(const Ref<XML>& xml)
  {
    if      (xml->name == "conffile"     ) return nullptr;
    else if (xml->name == "mtllib"       ) return loadMaterialLibrary(load<FileName>(xml));
    else if (xml->name == "camera"       ) return nullptr;
    else if (xml->name == "environment"  ) return nullptr;
    else if (xml->name == "geometryGroup") return loadGroupNode(xml);
    else if (xml->name == "renderElement") return nullptr;
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
    return nullptr;
  }